

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O2

void SUNMatFreeEmpty(SUNMatrix A)

{
  if (A != (SUNMatrix)0x0) {
    free(A->ops);
    free(A);
    return;
  }
  return;
}

Assistant:

void SUNMatFreeEmpty(SUNMatrix A)
{
  if (A == NULL)  return;

  /* free non-NULL ops structure */
  if (A->ops)  free(A->ops);
  A->ops = NULL;

  /* free overall SUNMatrix object and return */
  free(A);
  return;
}